

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopt-errors.c
# Opt level: O2

void gopt_errors(char *argv0,option *options)

{
  uint uVar1;
  uint uVar2;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar3;
  
  uVar3 = 0xffffffffffffffff;
  do {
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
  } while ((options[uVar3].flags & 0x100) == 0);
  iVar6 = (int)options[uVar3].short_name;
  if (iVar6 == 0) {
    pcVar4 = options[uVar3].long_name;
    if (pcVar4 == (char *)0x0) {
      lVar9 = 0;
      do {
        lVar8 = lVar9;
        lVar9 = lVar8 + 0x20;
        if ((ulong)uVar2 * 0x20 + 0x20 == lVar9) {
          return;
        }
        uVar1 = *(uint *)((long)&options->flags + lVar8);
        uVar7 = ~uVar1;
        if ((uVar7 & 0x12) == 0) {
          iVar6 = (int)(&options->short_name)[lVar8];
          pcVar4 = "%s: option -%c requires an option-argument\n";
          goto LAB_00102e92;
        }
        if ((uVar7 & 0x21) == 0) {
          iVar6 = (int)(&options->short_name)[lVar8];
          pcVar4 = "%s: option -%c must not have an option-argument\n";
          goto LAB_00102e92;
        }
        if ((uVar7 & 0x42) == 0) {
          pcVar4 = *(char **)((long)&options->long_name + lVar8);
          pcVar5 = "%s: option --%s requires an option-argument\n";
          goto LAB_00102ece;
        }
        if ((uVar7 & 0x81) == 0) {
          pcVar4 = *(char **)((long)&options->long_name + lVar8);
          pcVar5 = "%s: option --%s must not have an option-argument\n";
          goto LAB_00102ece;
        }
      } while (((uVar1 & 8) != 0) || (*(uint *)((long)&options->count + lVar8) < 2));
      __fprintf_chk(_stderr,1,"%s: option -%c/--%s may not be repeated\n",argv0,
                    (int)(&options->short_name)[lVar8],
                    *(undefined8 *)((long)&options->long_name + lVar8));
    }
    else {
      pcVar5 = "%s: unrecognised option --%s\n";
LAB_00102ece:
      __fprintf_chk(_stderr,1,pcVar5,argv0,pcVar4);
    }
  }
  else {
    pcVar4 = "%s: unrecognised option -%c\n";
LAB_00102e92:
    __fprintf_chk(_stderr,1,pcVar4,argv0,iVar6);
  }
  exit(1);
}

Assistant:

void gopt_errors (const char *argv0, const struct option *options)
{
  unsigned int bad_option_index = 0;
  unsigned int i;

  while (!(options[bad_option_index].flags & GOPT_LAST))
  {
    bad_option_index++;
  }

  if (options[bad_option_index].short_name)
  {
    fprintf (stderr, "%s: unrecognised option -%c\n", argv0, options[bad_option_index].short_name);
    exit (EX_USAGE);
  }

  if (options[bad_option_index].long_name)
  {
    fprintf (stderr, "%s: unrecognised option --%s\n", argv0, options[bad_option_index].long_name);
    exit (EX_USAGE);
  }

  for (i = 0; i < bad_option_index; i++)
  {
    if ((options[i].flags & GOPT_SEEN_SHORT_WITHOUT) && (options[i].flags & GOPT_ARGUMENT_REQUIRED))
    {
      fprintf (stderr, "%s: option -%c requires an option-argument\n", argv0, options[i].short_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_SHORT_WITH) && (options[i].flags & GOPT_ARGUMENT_FORBIDDEN))
    {
      fprintf (stderr, "%s: option -%c must not have an option-argument\n", argv0, options[i].short_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_LONG_WITHOUT) && (options[i].flags & GOPT_ARGUMENT_REQUIRED))
    {
      fprintf (stderr, "%s: option --%s requires an option-argument\n", argv0, options[i].long_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_LONG_WITH) && (options[i].flags & GOPT_ARGUMENT_FORBIDDEN))
    {
      fprintf (stderr, "%s: option --%s must not have an option-argument\n", argv0, options[i].long_name);
      exit (EX_USAGE);
    }

    if ((options[i].count > 1) && !(options[i].flags & GOPT_REPEATABLE))
    {
      fprintf (stderr, "%s: option -%c/--%s may not be repeated\n", argv0, options[i].short_name, options[i].long_name);
      exit (EX_USAGE);
    }
  }
}